

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall llvm::yaml::Output::postflightKey(Output *this,void *param_1)

{
  reference pIVar1;
  InState local_20 [2];
  void *local_18;
  void *param_1_local;
  Output *this_local;
  
  local_18 = param_1;
  param_1_local = this;
  pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                     ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                      &this->StateStack);
  if (*pIVar1 == inMapFirstKey) {
    SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::pop_back
              ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)&this->StateStack);
    local_20[1] = 5;
    SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::push_back
              ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)&this->StateStack,
               local_20 + 1);
  }
  else {
    pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                       ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                        &this->StateStack);
    if (*pIVar1 == inFlowMapFirstKey) {
      SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::pop_back
                ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)&this->StateStack);
      local_20[0] = inFlowMapOtherKey;
      SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::push_back
                ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)&this->StateStack,
                 local_20);
    }
  }
  return;
}

Assistant:

void Output::postflightKey(void *) {
  if (StateStack.back() == inMapFirstKey) {
    StateStack.pop_back();
    StateStack.push_back(inMapOtherKey);
  } else if (StateStack.back() == inFlowMapFirstKey) {
    StateStack.pop_back();
    StateStack.push_back(inFlowMapOtherKey);
  }
}